

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_hashmap_pop(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  long lVar1;
  jx9_hashmap_node *pNode;
  int iVar2;
  jx9_value *pValue;
  jx9_value *pObj;
  jx9_hashmap_node *pLast;
  jx9_hashmap *pMap;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if (nArg < 1) {
    jx9_result_null(pCtx);
  }
  else {
    iVar2 = jx9_value_is_json_array(*apArg);
    if (iVar2 == 0) {
      jx9_result_null(pCtx);
    }
    else {
      lVar1 = ((*apArg)->x).iVal;
      if (*(int *)(lVar1 + 0x2c) == 0) {
        jx9_result_null(pCtx);
      }
      else {
        pNode = *(jx9_hashmap_node **)(lVar1 + 0x18);
        pValue = HashmapExtractNodeValue(pNode);
        if (pValue == (jx9_value *)0x0) {
          jx9_result_null(pCtx);
        }
        else {
          jx9_result_value(pCtx,pValue);
          jx9HashmapUnlinkNode(pNode);
        }
        *(undefined8 *)(lVar1 + 0x20) = *(undefined8 *)(lVar1 + 0x10);
      }
    }
  }
  return 0;
}

Assistant:

static int jx9_hashmap_pop(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap *pMap;
	if( nArg < 1 ){
		/* Missing arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid hashmap */
	if( !jx9_value_is_json_array(apArg[0]) ){
		/* Invalid argument, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	if( pMap->nEntry < 1 ){
		/* Noting to pop, return NULL */
		jx9_result_null(pCtx);
	}else{
		jx9_hashmap_node *pLast = pMap->pLast;
		jx9_value *pObj;
		pObj = HashmapExtractNodeValue(pLast);
		if( pObj ){
			/* Node value */
			jx9_result_value(pCtx, pObj);
			/* Unlink the node */
			jx9HashmapUnlinkNode(pLast);
		}else{
			jx9_result_null(pCtx);
		}
		/* Reset the cursor */
		pMap->pCur = pMap->pFirst;
	}
	return JX9_OK;
}